

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

bool __thiscall QItemSelectionRange::isEmpty(QItemSelectionRange *this)

{
  QPersistentModelIndex *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  QAbstractItemModel *pQVar7;
  long in_FS_OFFSET;
  bool local_81;
  ulong local_78;
  QModelIndex local_70;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isValid(this);
  local_81 = true;
  if ((bVar2) &&
     (pQVar7 = QPersistentModelIndex::model(&this->tl), pQVar7 != (QAbstractItemModel *)0x0)) {
    uVar3 = QPersistentModelIndex::column(&this->tl);
    this_00 = &this->br;
    iVar4 = QPersistentModelIndex::column(this_00);
    local_81 = iVar4 < (int)uVar3;
    if ((int)uVar3 <= iVar4) {
      do {
        local_78 = (ulong)uVar3;
        uVar5 = QPersistentModelIndex::row(&this->tl);
        iVar4 = QPersistentModelIndex::row(this_00);
        bVar2 = iVar4 < (int)uVar5;
        if ((int)uVar5 <= iVar4) {
          do {
            local_48 = &DAT_aaaaaaaaaaaaaaaa;
            local_58 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
            pQVar7 = QPersistentModelIndex::model(&this->tl);
            QPersistentModelIndex::parent(&local_70,&this->tl);
            (*(pQVar7->super_QObject)._vptr_QObject[0xc])
                      (&local_58,pQVar7,(ulong)uVar5,local_78,&local_70);
            pQVar7 = QPersistentModelIndex::model(&this->tl);
            uVar6 = (*(pQVar7->super_QObject)._vptr_QObject[0x27])(pQVar7,&local_58);
            if ((~uVar6 & 0x21) == 0) {
              if (!bVar2) goto LAB_0046816a;
              break;
            }
            iVar4 = QPersistentModelIndex::row(this_00);
            bVar2 = iVar4 <= (int)uVar5;
            bVar1 = (int)uVar5 < iVar4;
            uVar5 = uVar5 + 1;
          } while (bVar1);
        }
        iVar4 = QPersistentModelIndex::column(this_00);
        local_81 = iVar4 <= (int)uVar3;
        bVar2 = (int)uVar3 < iVar4;
        uVar3 = uVar3 + 1;
      } while (bVar2);
    }
  }
LAB_0046816a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_81;
}

Assistant:

bool QItemSelectionRange::isEmpty() const
{
    if (!isValid() || !model())
        return true;

    for (int column = left(); column <= right(); ++column) {
        for (int row = top(); row <= bottom(); ++row) {
            QModelIndex index = model()->index(row, column, parent());
            if (isSelectableAndEnabled(model()->flags(index)))
                return false;
        }
    }
    return true;
}